

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AbstractWrittenFont.cpp
# Opt level: O3

EStatusCode __thiscall
AbstractWrittenFont::WriteGlyphEncodingInfoState
          (AbstractWrittenFont *this,ObjectsContext *inStateWriter,ObjectIDType inObjectID,
          GlyphEncodingInfo *inGlyphEncodingInfo)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  EStatusCode EVar2;
  Trace *this_00;
  DictionaryContext *this_01;
  pointer puVar3;
  string local_48;
  
  EVar2 = ObjectsContext::StartNewIndirectObject(inStateWriter,inObjectID);
  if (EVar2 == eSuccess) {
    this_01 = ObjectsContext::StartDictionary(inStateWriter);
    paVar1 = &local_48.field_2;
    local_48._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_48,"Type","");
    DictionaryContext::WriteKey(this_01,&local_48);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_48._M_dataplus._M_p != paVar1) {
      operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
    }
    local_48._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_48,"GlyphEncodingInfo","");
    DictionaryContext::WriteNameValue(this_01,&local_48);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_48._M_dataplus._M_p != paVar1) {
      operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
    }
    local_48._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_48,"mEncodedCharacter","");
    DictionaryContext::WriteKey(this_01,&local_48);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_48._M_dataplus._M_p != paVar1) {
      operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
    }
    DictionaryContext::WriteIntegerValue(this_01,(ulong)inGlyphEncodingInfo->mEncodedCharacter);
    local_48._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_48,"mUnicodeCharacters","");
    DictionaryContext::WriteKey(this_01,&local_48);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_48._M_dataplus._M_p != paVar1) {
      operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
    }
    ObjectsContext::StartArray(inStateWriter);
    for (puVar3 = (inGlyphEncodingInfo->mUnicodeCharacters).
                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                  super__Vector_impl_data._M_start;
        puVar3 != (inGlyphEncodingInfo->mUnicodeCharacters).
                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                  super__Vector_impl_data._M_finish; puVar3 = puVar3 + 1) {
      ObjectsContext::WriteInteger(inStateWriter,*puVar3,eTokenSeparatorSpace);
    }
    ObjectsContext::EndArray(inStateWriter,eTokenSeparatorEndLine);
    ObjectsContext::EndDictionary(inStateWriter,this_01);
    ObjectsContext::EndIndirectObject(inStateWriter);
  }
  else {
    this_00 = Trace::DefaultTrace();
    Trace::TraceToLog(this_00,
                      "AbstractWrittenFont::WriteGlyphEncodingInfoState, failed to write object for object ID = %ld"
                      ,inObjectID);
  }
  return EVar2;
}

Assistant:

EStatusCode AbstractWrittenFont::WriteGlyphEncodingInfoState(ObjectsContext* inStateWriter,
													  ObjectIDType inObjectID,
													  const GlyphEncodingInfo& inGlyphEncodingInfo)
{
	EStatusCode status = inStateWriter->StartNewIndirectObject(inObjectID);	
	if(status != PDFHummus::eSuccess) {
		TRACE_LOG1("AbstractWrittenFont::WriteGlyphEncodingInfoState, failed to write object for object ID = %ld",inObjectID);
		return status;
	}
	DictionaryContext* glyphEncodingInfoObject = inStateWriter->StartDictionary();

	glyphEncodingInfoObject->WriteKey("Type");
	glyphEncodingInfoObject->WriteNameValue("GlyphEncodingInfo");

	glyphEncodingInfoObject->WriteKey("mEncodedCharacter");
	glyphEncodingInfoObject->WriteIntegerValue(inGlyphEncodingInfo.mEncodedCharacter);

	glyphEncodingInfoObject->WriteKey("mUnicodeCharacters");
	inStateWriter->StartArray();
	
	ULongVector::const_iterator it = inGlyphEncodingInfo.mUnicodeCharacters.begin();
	for(; it != inGlyphEncodingInfo.mUnicodeCharacters.end();++it)
		inStateWriter->WriteInteger(*it);

	inStateWriter->EndArray(eTokenSeparatorEndLine);

	inStateWriter->EndDictionary(glyphEncodingInfoObject);
	inStateWriter->EndIndirectObject();

	return status;
	
}